

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O2

void __thiscall
Function::Function(Function *this,TypeName *returnType,ArgumentsList *arguments,
                  shared_ptr<BlockNode> *body,Context *context)

{
  (this->super_Value).valueType_ = Function;
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__Function_00149c40;
  *(TypeName *)&(this->super_Value).field_0xc = *returnType;
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::list(&this->arguments_,arguments);
  std::__shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>,
             &body->super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>);
  std::
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  ::deque(&(this->context_).scopes_,&context->scopes_);
  return;
}

Assistant:

Function(const TypeName& returnType, const ArgumentsList& arguments, std::shared_ptr<BlockNode> body, const Context& context):
    Value(TypeName::Function), returnType_(returnType), arguments_(arguments), body_(body), context_(context) {}